

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JobResults.cpp
# Opt level: O0

void __thiscall xmrig::JobResultsPrivate::submit(JobResultsPrivate *this)

{
  bool bVar1;
  reference pJVar2;
  JobBaton *this_00;
  undefined8 uVar3;
  _func_void_uv_work_t_ptr *p_Var4;
  _func_void_uv_work_t_ptr_int *p_Var5;
  long in_RDI;
  JobBaton *baton;
  JobResult *result;
  iterator __end2;
  iterator __begin2;
  list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *__range2;
  list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> results;
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> bundles;
  list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *in_stack_ffffffffffffff58;
  undefined1 hwAES;
  mutex *in_stack_ffffffffffffff60;
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *in_stack_ffffffffffffff68;
  _lambda_uv_work_s__int__1_ local_7a;
  _lambda_uv_work_s___1_ local_79;
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Self local_60;
  _Self local_58;
  undefined1 *local_50;
  undefined1 local_38 [24];
  list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> local_20;
  
  std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::list
            ((list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)0x233269);
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::list
            ((list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)0x233273);
  std::mutex::lock(in_stack_ffffffffffffff60);
  std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::swap
            ((list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::swap
            ((list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)in_stack_ffffffffffffff88)
  ;
  std::mutex::unlock((mutex *)0x2332ba);
  local_50 = local_38;
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::begin
                 (in_stack_ffffffffffffff58);
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::end
                 (in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::operator!=(&local_58,&local_60);
    hwAES = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
    if (!bVar1) break;
    pJVar2 = std::_List_iterator<xmrig::JobResult>::operator*
                       ((_List_iterator<xmrig::JobResult> *)in_stack_ffffffffffffff60);
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),pJVar2);
    std::_List_iterator<xmrig::JobResult>::operator++(&local_58);
  }
  bVar1 = std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::empty(&local_20);
  if (!bVar1) {
    this_00 = (JobBaton *)operator_new(200);
    JobBaton::JobBaton(this_00,in_stack_ffffffffffffff68,
                       (IJobResultListener *)in_stack_ffffffffffffff60,(bool)hwAES);
    uVar3 = uv_default_loop();
    p_Var4 = submit()::{lambda(uv_work_s*)#1}::operator_cast_to_function_pointer(&local_79);
    p_Var5 = submit()::{lambda(uv_work_s*,int)#1}::operator_cast_to_function_pointer(&local_7a);
    uv_queue_work(uVar3,this_00,p_Var4,p_Var5);
  }
  std::__cxx11::list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_>::~list
            ((list<xmrig::JobResult,_std::allocator<xmrig::JobResult>_> *)0x2333fb);
  std::__cxx11::list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_>::~list
            ((list<xmrig::JobBundle,_std::allocator<xmrig::JobBundle>_> *)0x233408);
  return;
}

Assistant:

inline void submit()
    {
        std::list<JobBundle> bundles;
        std::list<JobResult> results;

        m_mutex.lock();
        m_bundles.swap(bundles);
        m_results.swap(results);
        m_mutex.unlock();

        for (const auto &result : results) {
            m_listener->onJobResult(result);
        }

        if (bundles.empty()) {
            return;
        }

        auto baton = new JobBaton(std::move(bundles), m_listener, m_hwAES);

        uv_queue_work(uv_default_loop(), &baton->req,
            [](uv_work_t *req) {
                auto baton = static_cast<JobBaton*>(req->data);

                for (JobBundle &bundle : baton->bundles) {
                    getResults(bundle, baton->results, baton->errors, baton->hwAES);
                }
            },
            [](uv_work_t *req, int) {
                auto baton = static_cast<JobBaton*>(req->data);

                for (const auto &result : baton->results) {
                    baton->listener->onJobResult(result);
                }

                delete baton;
            }
        );
    }